

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::SplitterBehavior
               (ImGuiID id,ImRect *bb,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend)

{
  undefined8 *puVar1;
  uint uVar2;
  ImGuiID IVar3;
  ImGuiWindow *pIVar4;
  undefined8 uVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  int iVar9;
  ImU32 col;
  char cVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  bool held;
  bool hovered;
  ImRect bb_render;
  ImRect bb_interact;
  bool local_9e;
  bool local_9d;
  float local_9c;
  ImVec2 local_98;
  ImVec2 aIStack_90 [2];
  ImGuiContext *local_80;
  float local_78;
  float local_74;
  float *local_70;
  float *local_68;
  ImGuiWindow *local_60;
  ImRect local_58;
  ImVec4 local_48;
  
  local_80 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  uVar2 = (pIVar4->DC).ItemFlags;
  (pIVar4->DC).ItemFlags = uVar2 | 0x18;
  local_9c = hover_extend;
  local_78 = min_size2;
  local_74 = min_size1;
  local_70 = size1;
  local_68 = size2;
  bVar8 = ItemAdd(bb,id,(ImRect *)0x0);
  pIVar7 = local_80;
  (pIVar4->DC).ItemFlags = uVar2;
  cVar10 = '\0';
  if (bVar8) {
    fVar11 = 0.0;
    if (axis == ImGuiAxis_Y) {
      fVar11 = local_9c;
      local_9c = 0.0;
    }
    local_58.Min.x = (bb->Min).x;
    local_58.Min.y = (bb->Min).y;
    local_80 = (ImGuiContext *)CONCAT44(local_80._4_4_,local_58.Min.x - local_9c);
    local_58.Min.y = local_58.Min.y - fVar11;
    local_58.Min.x = local_58.Min.x - local_9c;
    local_58.Max.x = (bb->Max).x;
    local_58.Max.y = (bb->Max).y;
    local_58.Max.y = fVar11 + local_58.Max.y;
    local_58.Max.x = local_9c + local_58.Max.x;
    local_9c = local_58.Min.y;
    local_60 = pIVar4;
    ButtonBehavior(&local_58,id,&local_9d,&local_9e,0x60);
    pIVar6 = GImGui;
    if (pIVar7->ActiveId != id) {
      IVar3 = (GImGui->CurrentWindow->DC).LastItemId;
      if (GImGui->HoveredId == IVar3) {
        GImGui->HoveredIdAllowOverlap = true;
      }
      if (pIVar6->ActiveId == IVar3) {
        pIVar6->ActiveIdAllowOverlap = true;
      }
    }
    if ((local_9e != false) || ((pIVar7->HoveredId == id && (pIVar7->HoveredIdPreviousFrame == id)))
       ) {
      GImGui->MouseCursor = (axis != ImGuiAxis_Y) + 3;
    }
    local_98 = bb->Min;
    aIStack_90[0] = bb->Max;
    if (local_9e != false) {
      if (axis == ImGuiAxis_Y) {
        fVar11 = ((pIVar7->IO).MousePos.y - (pIVar7->ActiveIdClickOffset).y) - local_9c;
      }
      else {
        fVar11 = ((pIVar7->IO).MousePos.x - (pIVar7->ActiveIdClickOffset).x) - local_80._0_4_;
      }
      fVar13 = local_74 - *local_70;
      if (fVar13 <= fVar11) {
        fVar13 = fVar11;
      }
      fVar11 = *local_68 - local_78;
      if (fVar13 <= *local_68 - local_78) {
        fVar11 = fVar13;
      }
      *local_70 = *local_70 + fVar11;
      *local_68 = *local_68 - fVar11;
      fVar12 = 0.0;
      fVar13 = fVar11;
      if (axis == ImGuiAxis_X) {
        fVar13 = 0.0;
        fVar12 = fVar11;
      }
      local_98.y = local_98.y + fVar13;
      local_98.x = local_98.x + fVar12;
      aIStack_90[0].y = fVar13 + aIStack_90[0].y;
      aIStack_90[0].x = fVar12 + aIStack_90[0].x;
    }
    iVar9 = 0x1d;
    if (local_9e == false) {
      iVar9 = (local_9d & 1) + 0x1b;
    }
    puVar1 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar9 << 4));
    local_48._0_8_ = *puVar1;
    uVar5 = puVar1[1];
    local_48.w = (float)((ulong)uVar5 >> 0x20);
    local_48.z = (float)uVar5;
    local_48.w = (GImGui->Style).Alpha * local_48.w;
    col = ColorConvertFloat4ToU32(&local_48);
    ImDrawList::AddRectFilled
              (local_60->DrawList,&local_98,aIStack_90,col,(pIVar7->Style).FrameRounding,0xf);
    cVar10 = local_9e;
  }
  return (bool)cVar10;
}

Assistant:

bool ImGui::SplitterBehavior(ImGuiID id, const ImRect& bb, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        if (mouse_delta < min_size1 - *size1)
            mouse_delta = min_size1 - *size1;
        if (mouse_delta > *size2 - min_size2)
            mouse_delta = *size2 - min_size2;

        // Apply resize
        *size1 += mouse_delta;
        *size2 -= mouse_delta;
        bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, g.Style.FrameRounding);

    return held;
}